

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_repeated_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::RepeatedMessageFieldGenerator::GenerateMembers
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *pFVar1;
  Type TVar2;
  int iVar3;
  Descriptor *pDVar4;
  WrapperFieldGenerator *this_00;
  Options *pOVar5;
  
  variables = &(this->super_FieldGeneratorBase).variables_;
  io::Printer::Print(printer,variables,
                     "private static readonly pb::FieldCodec<$type_name$> _repeated_$name$_codec\n    = "
                    );
  pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
  TVar2 = FieldDescriptor::type(pFVar1);
  if (TVar2 == TYPE_MESSAGE) {
    pDVar4 = FieldDescriptor::message_type(pFVar1);
    iVar3 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar4 + 0x10));
    if (iVar3 == 0) {
      this_00 = (WrapperFieldGenerator *)operator_new(0x60);
      pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
      iVar3 = (this->super_FieldGeneratorBase).fieldOrdinal_;
      pOVar5 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
      WrapperFieldGenerator::WrapperFieldGenerator(this_00,pFVar1,iVar3,pOVar5);
      (*(this_00->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4])
                (this_00,printer);
      goto LAB_00214361;
    }
  }
  this_00 = (WrapperFieldGenerator *)operator_new(0x58);
  pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
  iVar3 = (this->super_FieldGeneratorBase).fieldOrdinal_;
  pOVar5 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)this_00,pFVar1,iVar3,pOVar5)
  ;
  (*(this_00->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4])
            (this_00,printer);
LAB_00214361:
  (*(this_00->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[1])
            (this_00);
  io::Printer::Print(printer,";\n");
  io::Printer::Print(printer,variables,
                     "private readonly pbc::RepeatedField<$type_name$> $name$_ = new pbc::RepeatedField<$type_name$>();\n"
                    );
  WritePropertyDocComment(printer,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  io::Printer::Print(printer,variables,
                     "$access_level$ pbc::RepeatedField<$type_name$> $property_name$ {\n  get { return $name$_; }\n}\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::GenerateMembers(io::Printer* printer) {
  printer->Print(
    variables_,
    "private static readonly pb::FieldCodec<$type_name$> _repeated_$name$_codec\n"
    "    = ");
  // Don't want to duplicate the codec code here... maybe we should have a
  // "create single field generator for this repeated field"
  // function, but it doesn't seem worth it for just this.
  if (IsWrapperType(descriptor_)) {
    scoped_ptr<FieldGeneratorBase> single_generator(
      new WrapperFieldGenerator(descriptor_, fieldOrdinal_, this->options()));
    single_generator->GenerateCodecCode(printer);
  } else {
    scoped_ptr<FieldGeneratorBase> single_generator(
      new MessageFieldGenerator(descriptor_, fieldOrdinal_, this->options()));
    single_generator->GenerateCodecCode(printer);
  }
  printer->Print(";\n");
  printer->Print(
    variables_,
    "private readonly pbc::RepeatedField<$type_name$> $name$_ = new pbc::RepeatedField<$type_name$>();\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ pbc::RepeatedField<$type_name$> $property_name$ {\n"
    "  get { return $name$_; }\n"
    "}\n");
}